

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void slider_size_cb(Fl_Value_Input *i,void *v)

{
  double v_00;
  bool bVar1;
  int iVar2;
  Fl_Widget_Type *q;
  Fl_Type *pFVar3;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    (*(((i->super_Fl_Valuator).super_Fl_Widget.parent_)->super_Fl_Widget)._vptr_Fl_Widget
      [(ulong)(iVar2 != 0) + 5])();
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar2 < 2) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    Fl_Valuator::value(&i->super_Fl_Valuator,(double)(float)current_widget->o[1].h_);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    v_00 = (i->super_Fl_Valuator).value_;
    bVar1 = false;
    pFVar3 = Fl_Type::first;
    do {
      if (pFVar3->selected != '\0') {
        iVar2 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3);
        if (iVar2 != 0) {
          iVar2 = (*pFVar3->_vptr_Fl_Type[0x1c])(pFVar3);
          if (1 < iVar2) {
            Fl_Slider::slider_size((Fl_Slider *)pFVar3[1].prev,v_00);
            Fl_Widget::redraw((Fl_Widget *)pFVar3[1].prev);
            bVar1 = true;
          }
        }
      }
      pFVar3 = pFVar3->next;
    } while (pFVar3 != (Fl_Type *)0x0);
    if (bVar1) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void slider_size_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_window()) 
      i->parent()->hide(); 
    else
      i->parent()->show();
    if (current_widget->is_valuator()<2) {i->deactivate(); return;}
    i->activate();
    i->value(((Fl_Slider*)(current_widget->o))->slider_size());
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	if (q->is_valuator()>=2) {
	  ((Fl_Slider*)(q->o))->slider_size(n);
	  q->o->redraw();
	  mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}